

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

void strpool_defrag(strpool_t *pool)

{
  strpool_internal_entry_t *psVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  strpool_internal_entry_t *psVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  strpool_internal_hash_slot_t *__s;
  char *pcVar12;
  strpool_internal_entry_t *psVar13;
  strpool_internal_block_t *psVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint v;
  uint uVar19;
  char *__dest;
  int i;
  strpool_internal_entry_t *psVar20;
  long lVar21;
  int iVar22;
  
  uVar16 = 0;
  uVar11 = (ulong)(uint)pool->entry_count;
  if (pool->entry_count < 1) {
    uVar11 = uVar16;
  }
  v = 0;
  uVar19 = 0;
  for (; uVar11 * 0x20 != uVar16; uVar16 = uVar16 + 0x20) {
    if (0 < *(int *)((long)&pool->entries->refcount + uVar16)) {
      uVar19 = uVar19 + *(int *)((long)&pool->entries->size + uVar16);
      v = v + 1;
    }
  }
  uVar9 = pool->block_size;
  if ((int)uVar9 <= (int)uVar19) {
    uVar9 = strpool_internal_pow2ceil(uVar19);
  }
  uVar10 = (int)v / 2 + v;
  uVar19 = pool->initial_entry_capacity * 2;
  if ((int)uVar19 <= (int)uVar10) {
    uVar19 = strpool_internal_pow2ceil(uVar10);
  }
  __s = (strpool_internal_hash_slot_t *)
        (**pool->memctx)(0,(long)(int)uVar19 * 0xc,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (__s == (strpool_internal_hash_slot_t *)0x0) {
    __assert_fail("hash_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x29e,"void strpool_defrag(strpool_t *)");
  }
  memset(__s,0,(long)(int)uVar19 * 0xc);
  pcVar12 = (char *)(**pool->memctx)(0,(long)(int)uVar9,0,0,0,0,
                                     *(undefined8 *)((long)pool->memctx + 8));
  if (pcVar12 == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x2a2,"void strpool_defrag(strpool_t *)");
  }
  uVar10 = pool->initial_entry_capacity;
  if ((int)uVar10 <= (int)v) {
    uVar10 = strpool_internal_pow2ceil(v);
  }
  iVar22 = 0;
  psVar13 = (strpool_internal_entry_t *)
            (**pool->memctx)(0,(long)(int)uVar10 << 5,0,0,0,0,
                             *(undefined8 *)((long)pool->memctx + 8));
  if (psVar13 == (strpool_internal_entry_t *)0x0) {
    __assert_fail("entries",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x2a7,"void strpool_defrag(strpool_t *)");
  }
  lVar17 = 0;
  __dest = pcVar12;
  do {
    if (pool->entry_count <= lVar17) {
      (**pool->memctx)(pool->hash_table,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      lVar17 = 8;
      for (lVar21 = 0; lVar21 < pool->block_count; lVar21 = lVar21 + 1) {
        (**pool->memctx)(*(undefined8 *)((long)&pool->blocks->capacity + lVar17),0,0,0,0,0,
                         *(undefined8 *)((long)pool->memctx + 8));
        lVar17 = lVar17 + 0x20;
      }
      iVar22 = pool->block_capacity;
      psVar14 = pool->blocks;
      if (iVar22 != pool->initial_block_capacity) {
        (**pool->memctx)(psVar14,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
        psVar14 = (strpool_internal_block_t *)
                  (**pool->memctx)(0,(long)pool->initial_block_capacity << 5,0,0,0,0,
                                   *(undefined8 *)((long)pool->memctx + 8));
        pool->blocks = psVar14;
        if (psVar14 == (strpool_internal_block_t *)0x0) {
          __assert_fail("pool->blocks",
                        "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                        ,0x2cf,"void strpool_defrag(strpool_t *)");
        }
        iVar22 = pool->initial_block_capacity;
      }
      pool->block_capacity = iVar22;
      pool->block_count = 1;
      pool->current_block = 0;
      psVar14->capacity = uVar9;
      psVar14->data = pcVar12;
      psVar14->tail = __dest;
      psVar14->free_list = -1;
      pool->hash_table = __s;
      pool->hash_capacity = uVar19;
      pool->entries = psVar13;
      pool->entry_capacity = uVar10;
      pool->entry_count = v;
      return;
    }
    if (0 < pool->entries[lVar17].refcount) {
      psVar20 = pool->entries + lVar17;
      psVar1 = psVar13 + iVar22;
      iVar7 = psVar20->hash_slot;
      iVar8 = psVar20->handle_index;
      pcVar4 = psVar20->data;
      iVar3 = psVar20->length;
      uVar5 = *(undefined8 *)&psVar20->refcount;
      psVar6 = psVar13 + iVar22;
      psVar6->size = psVar20->size;
      psVar6->length = iVar3;
      *(undefined8 *)(&psVar6->size + 2) = uVar5;
      psVar6 = psVar13 + iVar22;
      psVar6->hash_slot = iVar7;
      psVar6->handle_index = iVar8;
      psVar6->data = pcVar4;
      uVar2 = pool->hash_table[psVar20->hash_slot].hash_key;
      uVar18 = uVar2 & uVar19 - 1;
      uVar15 = uVar18;
      while (__s[(int)uVar15].hash_key != 0) {
        uVar15 = uVar15 + 1 & uVar19 - 1;
      }
      if (uVar2 == 0) {
        __assert_fail("hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x2b6,"void strpool_defrag(strpool_t *)");
      }
      __s[(int)uVar15].hash_key = uVar2;
      __s[(int)uVar15].entry_index = iVar22;
      __s[(int)uVar18].base_count = __s[(int)uVar18].base_count + 1;
      psVar1->hash_slot = uVar15;
      psVar1->data = __dest;
      iVar3 = psVar20->handle_index;
      psVar1->handle_index = iVar3;
      pool->handles[iVar3].entry_index = iVar22;
      memcpy(__dest,psVar20->data,(long)psVar20->length + 9);
      __dest = __dest + psVar20->size;
      iVar22 = iVar22 + 1;
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void strpool_defrag( strpool_t* pool )
    {
    int data_size = 0;
    int count = 0;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            data_size += entry->size;
            ++count;
            }
        }

    int data_capacity = data_size < pool->block_size ? 
        pool->block_size : (int)strpool_internal_pow2ceil( (STRPOOL_U32)data_size );

    int hash_capacity = count + count / 2;
    hash_capacity = hash_capacity < ( pool->initial_entry_capacity * 2 ) ? 
        ( pool->initial_entry_capacity * 2 ) : (int)strpool_internal_pow2ceil( (STRPOOL_U32)hash_capacity );
    strpool_internal_hash_slot_t* hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        hash_capacity * sizeof( *hash_table ) );
    STRPOOL_ASSERT( hash_table );
    STRPOOL_MEMSET( hash_table, 0, hash_capacity * sizeof( *hash_table ) );

    char* data = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) data_capacity );
    STRPOOL_ASSERT( data );
    int capacity = count < pool->initial_entry_capacity ? 
        pool->initial_entry_capacity : (int)strpool_internal_pow2ceil( (STRPOOL_U32)count );
    strpool_internal_entry_t* entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        capacity * sizeof( *entries ) );
    STRPOOL_ASSERT( entries );
    int index = 0;
    char* tail = data;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            entries[ index ] = *entry;

            STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
            int base_slot = (int)( hash & (STRPOOL_U32)( hash_capacity - 1 ) );
            int slot = base_slot;
            while( hash_table[ slot ].hash_key )
                slot = (slot + 1 ) & ( hash_capacity - 1 );
            STRPOOL_ASSERT( hash );
            hash_table[ slot ].hash_key = hash;
            hash_table[ slot ].entry_index = index;
            ++hash_table[ base_slot ].base_count;

            entries[ index ].hash_slot = slot;
            entries[ index ].data = tail;
            entries[ index ].handle_index = entry->handle_index;
            pool->handles[ entry->handle_index ].entry_index = index;
            STRPOOL_MEMCPY( tail, entry->data, entry->length + 1 + 2 * sizeof( STRPOOL_U32 ) );
            tail += entry->size;
            ++index;
            }
        }


    STRPOOL_FREE( pool->memctx, pool->hash_table );
    STRPOOL_FREE( pool->memctx, pool->entries );
    for( int i = 0; i < pool->block_count; ++i ) STRPOOL_FREE( pool->memctx, pool->blocks[ i ].data );

    if( pool->block_capacity != pool->initial_block_capacity )
        {
        STRPOOL_FREE( pool->memctx, pool->blocks );
        pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
            pool->initial_block_capacity * sizeof( *pool->blocks ) );
        STRPOOL_ASSERT( pool->blocks );
        }
    pool->block_capacity = pool->initial_block_capacity;
    pool->block_count = 1;
    pool->current_block = 0;
    pool->blocks[ 0 ].capacity = data_capacity;
    pool->blocks[ 0 ].data = data;
    pool->blocks[ 0 ].tail = tail;
    pool->blocks[ 0 ].free_list = -1;
    
    pool->hash_table = hash_table;
    pool->hash_capacity = hash_capacity;

    pool->entries = entries;
    pool->entry_capacity = capacity;
    pool->entry_count = count;
    }